

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_defines.hpp
# Opt level: O0

bool __thiscall
chaiscript::str_less::operator()
          (str_less *this,basic_string_view<char,_std::char_traits<char>_> *t_lhs,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_rhs)

{
  bool bVar1;
  const_iterator __first1;
  const_iterator __last1;
  const_iterator __first2;
  const_iterator __last2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_rhs_local;
  basic_string_view<char,_std::char_traits<char>_> *t_lhs_local;
  str_less *this_local;
  
  __first1 = std::basic_string_view<char,_std::char_traits<char>_>::begin(t_lhs);
  __last1 = std::basic_string_view<char,_std::char_traits<char>_>::end(t_lhs);
  __first2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                       (t_rhs);
  __last2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                      (t_rhs);
  bVar1 = std::
          lexicographical_compare<char_const*,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (__first1,__last1,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )__first2._M_current,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )__last2._M_current);
  return bVar1;
}

Assistant:

[[nodiscard]] constexpr bool operator()(const LHS &t_lhs, const RHS &t_rhs) const noexcept {
      return std::lexicographical_compare(t_lhs.begin(), t_lhs.end(), t_rhs.begin(), t_rhs.end());
    }